

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cc
# Opt level: O1

void __thiscall onmt::TokensBuilder::safe_append(TokensBuilder *this,CharInfo *character)

{
  int iVar1;
  int *piVar2;
  bool bVar3;
  
  if ((this->_no_substitution == false) && (bVar3 = substitutes_abi_cxx11_ == DAT_00388690, !bVar3))
  {
    iVar1 = *substitutes_abi_cxx11_;
    piVar2 = substitutes_abi_cxx11_;
    while (iVar1 != character->value) {
      piVar2 = piVar2 + 10;
      bVar3 = piVar2 == DAT_00388690;
      if (bVar3) goto LAB_001b5f56;
      iVar1 = *piVar2;
    }
    std::__cxx11::string::append((char *)&this->_current_token,*(ulong *)(piVar2 + 2));
    this->_current_length = this->_current_length + 1;
    if (!bVar3) {
      return;
    }
  }
LAB_001b5f56:
  std::__cxx11::string::append((char *)&this->_current_token,(ulong)character->data);
  this->_current_length = this->_current_length + 1;
  return;
}

Assistant:

void safe_append(const unicode::CharInfo& character)
    {
      if (!_no_substitution)
      {
        for (const auto& pair : substitutes)
        {
          if (pair.first == character.value)
          {
            append(pair.second);
            return;
          }
        }
      }

      append(character);
    }